

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::strings_internal::
SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  string_view text_00;
  bool bVar1;
  size_type sVar2;
  SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view d;
  string_view text;
  size_t in_stack_ffffffffffffff78;
  ByChar *in_stack_ffffffffffffff80;
  const_pointer in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  size_t local_50;
  char *local_48;
  string_view local_30;
  string_view local_20 [2];
  
  do {
    if (in_RDI->state_ == kLastState) {
      in_RDI->state_ = kEndState;
      return in_RDI;
    }
    local_20[0] = Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ::text(in_RDI->splitter_);
    text_00._M_str = (char *)in_stack_ffffffffffffff90;
    text_00._M_len = (size_t)in_stack_ffffffffffffff88;
    local_30 = ByChar::Find(in_stack_ffffffffffffff80,text_00,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff90 =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
    in_stack_ffffffffffffff88 =
         std::basic_string_view<char,_std::char_traits<char>_>::data(local_20);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_20);
    if (in_stack_ffffffffffffff90 ==
        (basic_string_view<char,_std::char_traits<char>_> *)(in_stack_ffffffffffffff88 + sVar2)) {
      in_RDI->state_ = kLastState;
    }
    in_stack_ffffffffffffff78 = in_RDI->pos_;
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
    std::basic_string_view<char,_std::char_traits<char>_>::data(local_20);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                       (size_type)in_stack_ffffffffffffff80);
    local_50 = bVar3._M_len;
    (in_RDI->curr_)._M_len = local_50;
    local_48 = bVar3._M_str;
    (in_RDI->curr_)._M_str = local_48;
    in_stack_ffffffffffffff80 =
         (ByChar *)std::basic_string_view<char,_std::char_traits<char>_>::size(&in_RDI->curr_);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
    in_RDI->pos_ = (size_t)(in_stack_ffffffffffffff80 + in_RDI->pos_ + sVar2);
    bVar1 = AllowEmpty::operator()((AllowEmpty *)&in_RDI->field_0x29,in_RDI->curr_);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return in_RDI;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }